

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void ActionUnserialize::
     SerReadWriteMany<DataStream,unsigned_char&,transaction_identifier<false>&,Wrapper<VarIntFormatter<(VarIntMode)0>,unsigned_int&>>
               (DataStream *s,uchar *args,transaction_identifier<false> *args_1,
               Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_int_&> *args_2)

{
  long lVar1;
  transaction_identifier<false> *in_RCX;
  uchar *in_RDX;
  DataStream *in_RSI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UnserializeMany<DataStream,unsigned_char&,transaction_identifier<false>&,Wrapper<VarIntFormatter<(VarIntMode)0>,unsigned_int&>&>
            (in_RSI,in_RDX,in_RCX,
             (Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_int_&> *)0x75e0d1);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void SerReadWriteMany(Stream& s, Args&&... args)
    {
        ::UnserializeMany(s, args...);
    }